

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O1

void RotationComp(sector_t_conflict *sec,int which,double dx,double dy,double *tdx,double *tdy)

{
  double dVar1;
  double dVar2;
  
  dVar2 = sec->planes[which].xform.baseAngle.Degrees + sec->planes[which].xform.Angle.Degrees;
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    dVar2 = FFastTrig::cos(&fasttrig,dx);
    dVar1 = FFastTrig::sin(&fasttrig,dVar2);
    *tdx = dVar1 * dy - dVar2 * dx;
    dy = -dVar1 * dx - dVar2 * dy;
  }
  else {
    *tdx = dx;
  }
  *tdy = dy;
  return;
}

Assistant:

static void RotationComp(const sector_t *sec, int which, double dx, double dy, double &tdx, double &tdy)
{
	DAngle an = sec->GetAngle(which);
	if (an == 0)
	{
		tdx = dx;
		tdy = dy;
	}
	else
	{
		double ca = -an.Cos();
		double sa = -an.Sin();
		tdx = dx*ca - dy*sa;
		tdy = dy*ca + dx*sa;
	}
}